

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.h
# Opt level: O2

void __thiscall flow::PassManager::logDebug<int>(PassManager *this,char *msg,int args)

{
  char *pcVar1;
  string *this_00;
  int *in_R8;
  string_view format_str;
  int local_3c;
  string local_38;
  
  local_3c = args;
  pcVar1 = (char *)strlen(msg);
  format_str.size_ = (size_t)&local_3c;
  format_str.data_ = pcVar1;
  this_00 = &local_38;
  fmt::v5::format<int>(&local_38,(v5 *)msg,format_str,in_R8);
  logDebug((PassManager *)this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void logDebug(const char* msg, Args... args) {
    logDebug(fmt::format(msg, args...));
  }